

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Module::mapInstruction(Module *this,Instruction *instruction)

{
  uint uVar1;
  pointer ppIVar2;
  
  uVar1 = instruction->resultId;
  ppIVar2 = (this->idToInstruction).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->idToInstruction).
                    super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2 >> 3) <= (ulong)uVar1)
  {
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::resize
              (&this->idToInstruction,(ulong)(uVar1 + 0x10));
    ppIVar2 = (this->idToInstruction).
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  ppIVar2[uVar1] = instruction;
  return;
}

Assistant:

void mapInstruction(Instruction *instruction)
    {
        spv::Id resultId = instruction->getResultId();
        // map the instruction's result id
        if (resultId >= idToInstruction.size())
            idToInstruction.resize(resultId + 16);
        idToInstruction[resultId] = instruction;
    }